

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

double __thiscall CLOptions::AsDouble(CLOptions *this,string *param_name)

{
  size_type sVar1;
  mapped_type *ppCVar2;
  ostream *poVar3;
  double dVar4;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
          ::count(&this->params_doubles,param_name);
  if (sVar1 != 0) {
    ppCVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
              ::operator[](&this->params_doubles,param_name);
    dVar4 = CLParam<double>::getValue(&(*ppCVar2)->super_CLParam<double>);
    return dVar4;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] CLOptions::AsDouble() :: Parameter \"");
  poVar3 = std::operator<<(poVar3,(string *)param_name);
  poVar3 = std::operator<<(poVar3,"\" is not a double!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return 0.0;
}

Assistant:

double CLOptions::AsDouble(const std::string& param_name)
{
    if (params_doubles.count(param_name) == 0) {
        std::cerr << "[ERROR] CLOptions::AsDouble() :: Parameter \"" << param_name << "\" is not a double!" << std::endl;
        return 0 ;
    } else {
        return params_doubles[param_name]->getValue();
    }
}